

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O3

void duckdb_destroy_config(duckdb_config *config)

{
  DBConfig *this;
  DBConfig *db_config;
  
  if ((config != (duckdb_config *)0x0) && (this = (DBConfig *)*config, this != (DBConfig *)0x0)) {
    duckdb::DBConfig::~DBConfig(this);
    operator_delete(this);
    *config = (duckdb_config)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_config(duckdb_config *config) {
	if (!config) {
		return;
	}
	if (*config) {
		auto db_config = (DBConfig *)*config;
		delete db_config;
		*config = nullptr;
	}
}